

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QString * __thiscall
QFSCompleter::pathFromIndex(QString *__return_storage_ptr__,QFSCompleter *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  int *piVar3;
  char cVar4;
  long *plVar5;
  long in_FS_OFFSET;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  QArrayData *local_68;
  short *psStack_60;
  undefined1 *local_58;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->proxyModel != (QAbstractProxyModel *)0x0) {
    QAbstractProxyModel::sourceModel();
    QMetaObject::cast((QObject *)&QFileSystemModel::staticMetaObject);
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_60 = (short *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::rootPath();
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x90))(&local_48,pQVar1,index,0x101);
  }
  ::QVariant::toString();
  ::QVariant::~QVariant((QVariant *)&local_48);
  if ((local_58 == (undefined1 *)0x0) ||
     (cVar4 = QString::startsWith((QString *)&local_88,(CaseSensitivity)&local_68), cVar4 == '\0'))
  {
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      local_30 = 2;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_48,pQVar1,index,0x101);
    }
    ::QVariant::toString();
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    if ((local_58 != (undefined1 *)0x1) || (*psStack_60 != 0x2f)) {
      QString::endsWith((QChar)(char16_t)&local_68,0x2f);
    }
    plVar5 = (long *)QString::remove((longlong)&local_88,0);
    pDVar2 = (Data *)*plVar5;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (char16_t *)plVar5[1];
    (__return_storage_ptr__->d).size = plVar5[2];
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  piVar3 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),2,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFSCompleter::pathFromIndex(const QModelIndex &index) const
{
    const QFileSystemModel *dirModel;
    if (proxyModel)
        dirModel = qobject_cast<const QFileSystemModel *>(proxyModel->sourceModel());
    else
        dirModel = sourceModel;
    QString currentLocation = dirModel->rootPath();
    QString path = index.data(QFileSystemModel::FilePathRole).toString();
    if (!currentLocation.isEmpty() && path.startsWith(currentLocation)) {
#if defined(Q_OS_UNIX)
        if (currentLocation == QDir::separator())
            return path.remove(0, currentLocation.size());
#endif
        if (currentLocation.endsWith(u'/'))
            return path.remove(0, currentLocation.size());
        else
            return path.remove(0, currentLocation.size()+1);
    }
    return index.data(QFileSystemModel::FilePathRole).toString();
}